

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

void skip_spaces(FT_Byte **acur,FT_Byte *limit)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ulong uVar4;
  
  pbVar1 = *acur;
  do {
    if ((limit <= pbVar1) || (uVar4 = (ulong)*pbVar1, 0x25 < uVar4)) goto LAB_0023016e;
    if ((0x100003601U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 != 0x25) {
LAB_0023016e:
        *acur = pbVar1;
        return;
      }
      bVar3 = 0x25;
      while (((pbVar2 = pbVar1 + 1, bVar3 != 10 && (bVar3 != 0xd)) &&
             (pbVar1 = limit, pbVar2 != limit))) {
        bVar3 = *pbVar2;
        pbVar1 = pbVar2;
      }
    }
    pbVar1 = pbVar1 + 1;
  } while( true );
}

Assistant:

static void
  skip_spaces( FT_Byte*  *acur,
               FT_Byte*   limit )
  {
    FT_Byte*  cur = *acur;


    while ( cur < limit )
    {
      if ( !IS_PS_SPACE( *cur ) )
      {
        if ( *cur == '%' )
          /* According to the PLRM, a comment is equal to a space. */
          skip_comment( &cur, limit );
        else
          break;
      }
      cur++;
    }

    *acur = cur;
  }